

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  CppType CVar1;
  FieldDescriptor *in_RCX;
  allocator local_c1;
  Options local_c0;
  
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar1 == CPPTYPE_UINT64) {
    std::__cxx11::string::string((string *)&local_c0,"GG",&local_c1);
    UInt64ToString(__return_storage_ptr__,&local_c0.dllexport_decl,*(uint64 *)(this + 0x90));
  }
  else {
    if (CVar1 != CPPTYPE_INT64) {
      __s = &local_c0.dllexport_decl.field_2;
      memset(__s,0,0x88);
      local_c0.dllexport_decl._M_string_length = 0;
      local_c0.safe_boundary_check = false;
      local_c0.transitive_pb_h = true;
      local_c0.runtime_include_base._M_dataplus._M_p =
           (pointer)&local_c0.runtime_include_base.field_2;
      local_c0.annotate_headers = false;
      local_c0.enforce_mode = kNoEnforcement;
      local_c0.table_driven_parsing = false;
      local_c0.table_driven_serialization = false;
      local_c0.lite_implicit_weak_fields = false;
      local_c0.bootstrap = false;
      local_c0.opensource_runtime = false;
      local_c0.annotate_accessor = false;
      local_c0.runtime_include_base.field_2._M_local_buf[0] = '\0';
      local_c0.annotation_pragma_name._M_dataplus._M_p =
           (pointer)&local_c0.annotation_pragma_name.field_2;
      local_c0.annotation_pragma_name.field_2._M_local_buf[0] = '\0';
      local_c0.annotation_guard_name._M_dataplus._M_p =
           (pointer)&local_c0.annotation_guard_name.field_2;
      local_c0.annotation_guard_name.field_2._M_local_buf[0] = '\0';
      local_c0.access_info_map = (AccessInfoMap *)0x0;
      local_c0.dllexport_decl._M_dataplus._M_p = (pointer)__s;
      DefaultValue_abi_cxx11_(__return_storage_ptr__,(cpp *)&local_c0,(Options *)this,in_RCX);
      Options::~Options(&local_c0);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_c0,"GG",&local_c1);
    Int64ToString(__return_storage_ptr__,&local_c0.dllexport_decl,*(int64 *)(this + 0x90));
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("GG", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("GG", field->default_value_uint64());
    default:
      return DefaultValue(Options(), field);
  }
}